

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

void __thiscall
miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>
          (Node<unsigned_int> *this,KeyParser *ctx)

{
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  _Base_ptr p_Var4;
  Comp CVar5;
  pointer poVar6;
  pointer poVar7;
  bool bVar8;
  bool bVar9;
  uchar auVar11 [4];
  byte bVar10;
  _Rb_tree_node_base *__tmp;
  _Rb_tree_header *p_Var12;
  ulong uVar13;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  long lVar16;
  pointer poVar17;
  pointer poVar18;
  uchar auVar19 [4];
  bool *in_RCX;
  undefined8 *puVar20;
  _Rb_tree_header *p_Var21;
  uchar auVar22 [4];
  _Rb_tree_header *p_Var23;
  _Rb_tree_node_base *p_Var24;
  ulong uVar25;
  void *pvVar26;
  _Self __tmp_2;
  _Rb_tree_header *p_Var27;
  _Link_type __x;
  undefined8 *puVar28;
  pointer poVar29;
  long lVar30;
  ulong uVar31;
  _Rb_tree_impl<Comp,_false> *__src_impl;
  long lVar32;
  ulong uVar33;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar34;
  vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  results;
  vector<StackElem,_std::allocator<StackElem>_> stack;
  vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  local_198;
  void *local_178;
  void *pvStack_170;
  long local_168;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
  local_158;
  _Base_ptr local_128;
  _Rb_tree_node_base local_120;
  undefined1 local_100 [32];
  _Base_ptr local_e0;
  _Rb_tree_node_base *local_d8;
  _Rb_tree_node_base *p_Stack_d0;
  undefined1 local_c8 [40];
  _Base_ptr local_a0;
  _Rb_tree_header *local_98;
  _Rb_tree_header *p_Stack_90;
  ulong local_88;
  char local_80;
  byte local_78;
  Comp local_70;
  _Rb_tree_header local_68;
  byte local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_168 = 0;
  local_178 = (void *)0x0;
  pvStack_170 = (void *)0x0;
  local_198.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._24_8_ = local_c8._24_8_ & 0xffffffff00000000;
  std::
  vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1}>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lamb...espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1})const::StackElem>>
  ::
  emplace_back<miniscript::Node<unsigned_int>const&,int,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_)const::DummyState>
            ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lamb___espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>__1__const__StackElem>>
              *)&local_178,this,(int *)(local_c8 + 0x18),in_RCX);
  if (pvStack_170 == local_178) {
    p_Var21 = (_Rb_tree_header *)0x0;
    poVar18 = (pointer)0x0;
  }
  else {
    p_Var21 = (_Rb_tree_header *)0x0;
    pvVar26 = pvStack_170;
    do {
      p_Var23 = &local_158._M_impl.super__Rb_tree_header;
      lVar16 = *(long *)((long)pvVar26 + -0x18);
      p_Var27 = *(_Rb_tree_header **)((long)pvVar26 + -0x10);
      lVar1 = *(long *)(lVar16 + 0x38);
      lVar2 = *(long *)(lVar16 + 0x40);
      p_Var12 = (_Rb_tree_header *)(lVar2 - lVar1 >> 4);
      if (p_Var27 < p_Var12) {
        *(byte **)((long)pvVar26 + -0x10) = (byte *)((long)&(p_Var27->_M_header)._M_color + 1);
        local_c8._24_8_ = local_c8._24_8_ & 0xffffffff00000000;
        std::
        vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1}>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lamb...espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1})const::StackElem>>
        ::
        emplace_back<miniscript::Node<unsigned_int>const&,int,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_)const::DummyState>
                  ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lamb___espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>__1__const__StackElem>>
                    *)&local_178,*(Node<unsigned_int> **)((bool *)((long)p_Var27 * 0x10) + lVar1),
                   (int *)(local_c8 + 0x18),(bool *)((long)p_Var27 * 0x10));
        pvVar26 = pvStack_170;
      }
      else {
        p_Var27 = (_Rb_tree_header *)
                  (((long)p_Var21 -
                    (long)local_198.
                          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
        if (p_Var27 < p_Var12) {
          __assert_fail("results.size() >= node.subs.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                        ,0x273,
                        "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = std::optional<std::set<unsigned int, Comp>>, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:679:13)]"
                       );
        }
        if ((*(char *)(lVar16 + 0xa1) == '\x01') && (*(char *)(lVar16 + 0xa0) != '\0')) {
LAB_00db94aa:
          local_80 = '\0';
        }
        else {
          lVar32 = (long)local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                   (long)p_Var12 * -0x38 +
                   ((long)p_Var21 -
                   (long)local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
          lVar30 = lVar32;
          if (lVar2 != lVar1) {
            do {
              if (*(char *)(lVar30 + 0x30) == '\0') {
                *(undefined2 *)(lVar16 + 0xa0) = 0x101;
                goto LAB_00db94aa;
              }
              lVar30 = lVar30 + 0x38;
            } while ((_Rb_tree_header *)lVar30 != p_Var21);
          }
          p_Var12 = *(_Rb_tree_header **)(lVar16 + 8);
          puVar3 = *(undefined1 **)(lVar16 + 0x10);
          local_158._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = '\0';
          local_158._M_impl.super__Rb_tree_header._M_header._M_color._1_1_ = '\0';
          local_158._M_impl.super__Rb_tree_header._M_header._M_color._2_1_ = '\0';
          local_158._M_impl.super__Rb_tree_header._M_header._M_color._3_1_ = '\0';
          local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
          lVar30 = (long)puVar3 - (long)p_Var12;
          local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr =
               (Comp)(Comp)ctx;
          local_158._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var23->_M_header;
          local_158._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var23->_M_header;
          if (lVar30 != 0) {
            do {
              if (local_158._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00db9135:
                p_Var27 = p_Var12;
                pVar34 = std::
                         _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                         ::_M_get_insert_unique_pos(&local_158,(key_type_conflict3 *)p_Var12);
                p_Var23 = (_Rb_tree_header *)pVar34.second;
                bVar8 = pVar34.first != (_Rb_tree_node_base *)0x0;
              }
              else {
                p_Var27 = *(_Rb_tree_header **)
                           ((long)local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.
                                  ctx_ptr + 0x18);
                bVar8 = DuplicateKeyCheck<(anonymous_namespace)::KeyParser>::Comp::operator()
                                  ((Comp *)(((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                                              *)((long)local_158._M_impl.
                                                       super__Rb_tree_key_compare<Comp>.
                                                       _M_key_compare.ctx_ptr + 0x10))->
                                           super__Vector_base<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start,
                                   (uint *)p_Var27,
                                   (uint *)(ulong)((_Rb_tree_node_base *)
                                                  ((long)local_158._M_impl.super__Rb_tree_header.
                                                         _M_header._M_right + 0x20))->_M_color);
                if (!bVar8) goto LAB_00db9135;
                bVar8 = false;
                p_Var23 = (_Rb_tree_header *)
                          local_158._M_impl.super__Rb_tree_header._M_header._M_right;
              }
              if (p_Var23 != (_Rb_tree_header *)0x0) {
                bVar9 = true;
                if (!bVar8 && &local_158._M_impl.super__Rb_tree_header != p_Var23) {
                  bVar9 = DuplicateKeyCheck<(anonymous_namespace)::KeyParser>::Comp::operator()
                                    ((Comp *)(((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                                                *)((long)local_158._M_impl.
                                                         super__Rb_tree_key_compare<Comp>.
                                                         _M_key_compare.ctx_ptr + 0x10))->
                                             super__Vector_base<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start,
                                     (uint *)*(CScript **)
                                              ((long)local_158._M_impl.
                                                     super__Rb_tree_key_compare<Comp>._M_key_compare
                                                     .ctx_ptr + 0x18),
                                     (uint *)(ulong)(p_Var12->_M_header)._M_color);
                }
                p_Var27 = (_Rb_tree_header *)operator_new(0x28);
                ((_Rb_tree_node_base *)&p_Var27->_M_node_count)->_M_color =
                     (p_Var12->_M_header)._M_color;
                std::_Rb_tree_insert_and_rebalance
                          (bVar9,(_Rb_tree_node_base *)p_Var27,(_Rb_tree_node_base *)p_Var23,
                           (_Rb_tree_node_base *)&local_158._M_impl.super__Rb_tree_header);
                local_158._M_impl.super__Rb_tree_header._M_node_count =
                     local_158._M_impl.super__Rb_tree_header._M_node_count + 1;
              }
              p_Var12 = (_Rb_tree_header *)&(p_Var12->_M_header).field_0x4;
            } while (p_Var12 != (_Rb_tree_header *)puVar3);
          }
          uVar31 = lVar30 >> 2;
          if (local_158._M_impl.super__Rb_tree_header._M_node_count == uVar31) {
            uVar33 = uVar31;
            if (lVar2 != lVar1) {
              do {
                uVar25 = *(ulong *)(lVar32 + 0x28);
                uVar13 = uVar31;
                if (uVar31 < uVar25) {
                  p_Var4 = *(_Base_ptr *)(lVar32 + 0x10);
                  if (local_158._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
                  {
                    if (p_Var4 != (_Base_ptr)0x0) {
                      local_158._M_impl.super__Rb_tree_header._M_header._M_color =
                           *(_Rb_tree_color *)(lVar32 + 8);
                      local_158._M_impl.super__Rb_tree_header._M_header._M_left =
                           *(_Base_ptr *)(lVar32 + 0x18);
                      local_158._M_impl.super__Rb_tree_header._M_header._M_right =
                           *(_Base_ptr *)(lVar32 + 0x20);
                      ((_Rb_tree_impl<Comp,_false> *)&p_Var4->_M_parent)->
                      super__Rb_tree_key_compare<Comp> =
                           (_Rb_tree_key_compare<Comp>)&local_158._M_impl.super__Rb_tree_header;
                      *(undefined8 *)(lVar32 + 0x10) = 0;
                      *(long *)(lVar32 + 0x18) = lVar32 + 8U;
                      *(long *)(lVar32 + 0x20) = lVar32 + 8U;
                      *(undefined8 *)(lVar32 + 0x28) = 0;
                      uVar13 = uVar25;
                      uVar33 = uVar25;
                      local_158._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var4;
                      local_158._M_impl.super__Rb_tree_header._M_node_count = uVar25;
                    }
                  }
                  else if (p_Var4 == (_Base_ptr)0x0) {
                    *(_Rb_tree_color *)(lVar32 + 8) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_color;
                    *(_Base_ptr *)(lVar32 + 0x10) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_parent;
                    *(_Base_ptr *)(lVar32 + 0x18) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_left;
                    *(_Base_ptr *)(lVar32 + 0x20) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_right;
                    ((_Rb_tree_impl<Comp,_false> *)
                    &(local_158._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->
                    super__Rb_tree_key_compare<Comp> = (_Rb_tree_key_compare<Comp>)(lVar32 + 8);
                    *(ulong *)(lVar32 + 0x28) = uVar31;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_left =
                         &local_158._M_impl.super__Rb_tree_header._M_header;
                    local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
                    uVar13 = 0;
                    uVar33 = 0;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_right =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_left;
                  }
                  else {
                    *(_Base_ptr *)(lVar32 + 0x10) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_parent;
                    p_Var27 = *(_Rb_tree_header **)(lVar32 + 0x18);
                    *(_Base_ptr *)(lVar32 + 0x18) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_left;
                    p_Var23 = *(_Rb_tree_header **)(lVar32 + 0x20);
                    *(_Base_ptr *)(lVar32 + 0x20) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_right;
                    ((_Rb_tree_impl<Comp,_false> *)&p_Var4->_M_parent)->
                    super__Rb_tree_key_compare<Comp> =
                         (_Rb_tree_key_compare<Comp>)&local_158._M_impl.super__Rb_tree_header;
                    *(long *)(*(long *)(lVar32 + 0x10) + 8) = lVar32 + 8;
                    *(ulong *)(lVar32 + 0x28) = uVar31;
                    uVar13 = uVar25;
                    uVar33 = uVar25;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var4;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var27->_M_header;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var23->_M_header
                    ;
                    local_158._M_impl.super__Rb_tree_header._M_node_count = uVar25;
                  }
                  CVar5.ctx_ptr = *(TapSatisfier **)lVar32;
                  *(Comp *)lVar32 =
                       local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr;
                  local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr =
                       (Comp)(Comp)CVar5.ctx_ptr;
                }
                p_Var14 = *(_Rb_tree_node_base **)(lVar32 + 0x18);
                while (p_Var15 = p_Var14, p_Var15 != (_Rb_tree_node_base *)(lVar32 + 8U)) {
                  p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                  pVar34 = std::
                           _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                           ::_M_get_insert_unique_pos(&local_158,&p_Var15[1]._M_color);
                  p_Var24 = pVar34.second;
                  uVar13 = local_158._M_impl.super__Rb_tree_header._M_node_count;
                  uVar33 = local_158._M_impl.super__Rb_tree_header._M_node_count;
                  if (p_Var24 != (_Rb_tree_node_base *)0x0) {
                    p_Var15 = (_Rb_tree_node_base *)
                              std::_Rb_tree_rebalance_for_erase
                                        (p_Var15,(_Rb_tree_node_base *)(lVar32 + 8U));
                    *(long *)(lVar32 + 0x28U) = *(long *)(lVar32 + 0x28U) + 0xffffffffffffffff;
                    bVar8 = true;
                    if (&local_158._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var24 &&
                        pVar34.first == (_Rb_tree_node_base *)0x0) {
                      bVar8 = DuplicateKeyCheck<(anonymous_namespace)::KeyParser>::Comp::operator()
                                        ((Comp *)(((
                                                  vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                                                  *)((long)local_158._M_impl.
                                                           super__Rb_tree_key_compare<Comp>.
                                                           _M_key_compare.ctx_ptr + 0x10))->
                                                 super__Vector_base<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start,
                                         (uint *)*(CScript **)
                                                  ((long)local_158._M_impl.
                                                         super__Rb_tree_key_compare<Comp>.
                                                         _M_key_compare.ctx_ptr + 0x18),
                                         (uint *)(ulong)p_Var15[1]._M_color);
                    }
                    std::_Rb_tree_insert_and_rebalance
                              (bVar8,p_Var15,(_Rb_tree_node_base *)p_Var24,
                               (_Rb_tree_node_base *)&local_158._M_impl.super__Rb_tree_header);
                    uVar13 = local_158._M_impl.super__Rb_tree_header._M_node_count + 1;
                    uVar33 = uVar13;
                    local_158._M_impl.super__Rb_tree_header._M_node_count = uVar13;
                  }
                }
                uVar31 = uVar31 + uVar25;
                p_Var27 = p_Var21;
                if (uVar13 != uVar31) goto LAB_00db9488;
                lVar32 = lVar32 + 0x38;
              } while ((_Rb_tree_header *)lVar32 != p_Var21);
            }
            local_68._M_header._M_parent =
                 local_158._M_impl.super__Rb_tree_header._M_header._M_parent;
            *(undefined2 *)(lVar16 + 0xa0) = 0x100;
            local_70 = local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr;
            if (local_158._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
              auVar19[0] = '\0';
              auVar19[1] = '\0';
              auVar19[2] = '\0';
              auVar19[3] = '\0';
              local_68._M_header._M_left = &local_68._M_header;
              puVar3 = (undefined1 *)&local_68;
              p_Var27 = (_Rb_tree_header *)local_68._M_header._M_left;
            }
            else {
              *(_Rb_tree_header **)
               &((_Rb_tree_header *)
                &(local_158._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->
                _M_header = &local_68;
              local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              p_Var21 = &local_158._M_impl.super__Rb_tree_header;
              puVar3 = (undefined1 *)&local_158._M_impl.super__Rb_tree_header;
              local_68._M_header._M_left = local_158._M_impl.super__Rb_tree_header._M_header._M_left
              ;
              p_Var27 = (_Rb_tree_header *)
                        local_158._M_impl.super__Rb_tree_header._M_header._M_right;
              auVar19 = (uchar  [4])local_158._M_impl.super__Rb_tree_header._M_header._M_color;
              local_158._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var21->_M_header;
              local_158._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var21->_M_header;
              local_68._M_node_count = uVar33;
            }
            local_68._M_header._M_right = &p_Var27->_M_header;
            *(size_t *)((long)puVar3 + 0x20) = 0;
            local_40 = 1;
            local_68._M_header._M_color = (_Rb_tree_color)auVar19;
          }
          else {
LAB_00db9488:
            *(undefined2 *)(lVar16 + 0xa0) = 0x101;
            local_40 = 0;
          }
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
          ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                      *)local_158._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (_Link_type)p_Var27);
          p_Var4 = local_68._M_header._M_parent;
          local_80 = '\0';
          if ((local_40 & 1) != 0) {
            local_c8._24_8_ = local_70.ctx_ptr;
            if (local_68._M_header._M_parent == (_Base_ptr)0x0) {
              local_c8[0x20] = '\0';
              local_c8[0x21] = '\0';
              local_c8[0x22] = '\0';
              local_c8[0x23] = '\0';
              local_98 = (_Rb_tree_header *)(local_c8 + 0x20);
              puVar3 = local_c8 + 0x20;
              p_Var27 = local_98;
            }
            else {
              *(undefined1 **)
               &((_Rb_tree_header *)&(local_68._M_header._M_parent)->_M_parent)->_M_header =
                   local_c8 + 0x20;
              local_88 = local_68._M_node_count;
              local_68._M_header._M_parent = (_Base_ptr)0x0;
              puVar3 = (undefined1 *)&local_68;
              local_98 = (_Rb_tree_header *)local_68._M_header._M_left;
              p_Var27 = (_Rb_tree_header *)local_68._M_header._M_right;
              local_c8._32_4_ = local_68._M_header._M_color;
              local_68._M_header._M_left = &local_68._M_header;
              local_68._M_header._M_right = &local_68._M_header;
            }
            local_a0 = p_Var4;
            *(undefined8 *)((long)puVar3 + 0x20) = 0;
            local_80 = '\x01';
            p_Stack_90 = p_Var27;
          }
        }
        poVar18 = local_198.
                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_78 = 1;
        lVar16 = *(long *)(lVar16 + 0x40) - *(long *)(lVar16 + 0x38) >> 4;
        poVar29 = local_198.
                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (lVar16 * -0x38 != 0) {
          poVar29 = local_198.
                    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -lVar16;
          poVar17 = poVar29;
          do {
            if ((poVar17->
                super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                ._M_engaged == true) {
              (poVar17->
              super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
              ._M_engaged = false;
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
              ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                          *)*(_Base_ptr *)
                             ((long)&(poVar17->
                                     super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                     )._M_payload.
                                     super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                     ._M_payload._M_value._M_t + 0x10),(_Link_type)p_Var27);
            }
            poVar17 = poVar17 + 1;
          } while (poVar17 != poVar18);
        }
        local_198.
        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = poVar29;
        poVar29 = local_198.
                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        poVar18 = local_198.
                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_198.
            super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_198.
            super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)local_198.
                    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_198.
                    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00db9bc1;
            std::__throw_length_error("vector::_M_realloc_insert");
            goto LAB_00db9b08;
          }
          lVar16 = (long)local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          uVar33 = lVar16 * 0x6db6db6db6db6db7;
          uVar31 = uVar33;
          if (local_198.
              super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_198.
              super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar31 = 1;
          }
          uVar25 = uVar31 + uVar33;
          if (0x249249249249248 < uVar25) {
            uVar25 = 0x249249249249249;
          }
          if (CARRY8(uVar31,uVar33)) {
            uVar25 = 0x249249249249249;
          }
          if (uVar25 == 0) {
            poVar17 = (pointer)0x0;
          }
          else {
            poVar17 = (pointer)operator_new(uVar25 * 0x38);
          }
          lVar16 = lVar16 * 8;
          *(undefined1 *)
           ((long)&(poVar17->
                   super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                   ._M_engaged + lVar16) = 0;
          poVar6 = poVar17;
          poVar7 = poVar18;
          if (local_80 == '\x01') {
            puVar20 = (undefined8 *)
                      ((long)&(poVar17->
                              super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                              ._M_payload + lVar16);
            *puVar20 = local_c8._24_8_;
            p_Var21 = (_Rb_tree_header *)(puVar20 + 1);
            if (local_a0 == (_Base_ptr)0x0) {
              puVar20[2] = 0;
              puVar28 = puVar20 + 5;
              auVar22[0] = '\0';
              auVar22[1] = '\0';
              auVar22[2] = '\0';
              auVar22[3] = '\0';
              p_Var27 = p_Var21;
            }
            else {
              puVar20[2] = local_a0;
              *(_Rb_tree_header **)&((_Rb_tree_header *)&local_a0->_M_parent)->_M_header = p_Var21;
              puVar20[5] = local_88;
              local_a0 = (_Base_ptr)0x0;
              puVar28 = &local_88;
              p_Var21 = local_98;
              p_Var27 = p_Stack_90;
              auVar22 = (uchar  [4])local_c8._32_4_;
              local_98 = (_Rb_tree_header *)(local_c8 + 0x20);
              p_Stack_90 = (_Rb_tree_header *)(local_c8 + 0x20);
            }
            puVar20[3] = p_Var21;
            puVar20[4] = p_Var27;
            *puVar28 = 0;
            *(uchar (*) [4])(puVar20 + 1) = auVar22;
            *(undefined1 *)(puVar20 + 6) = 1;
          }
          for (; poVar29 != poVar7; poVar7 = poVar7 + 1) {
            (poVar6->
            super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
            ._M_engaged = false;
            bVar10 = (poVar7->
                     super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                     ._M_engaged;
            if ((bool)bVar10 == true) {
              *(undefined8 *)
               &(poVar6->
                super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                ._M_payload._M_value._M_t =
                   *(undefined8 *)
                    &(poVar7->
                     super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                     ._M_payload._M_value._M_t;
              p_Var27 = (_Rb_tree_header *)
                        ((long)&(poVar7->
                                super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                ._M_payload._M_value._M_t + 8);
              std::_Rb_tree_header::_Rb_tree_header
                        ((_Rb_tree_header *)
                         ((long)&(poVar6->
                                 super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                 ._M_payload._M_value._M_t + 8),p_Var27);
              (poVar6->
              super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
              ._M_engaged = true;
              bVar10 = (poVar7->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_engaged;
            }
            if ((bVar10 & 1) != 0) {
              (poVar7->
              super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
              ._M_engaged = false;
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
              ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                          *)*(_Base_ptr *)
                             ((long)&(poVar7->
                                     super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                     )._M_payload.
                                     super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                     ._M_payload._M_value._M_t + 0x10),(_Link_type)p_Var27);
            }
            poVar6 = poVar6 + 1;
          }
          if (poVar18 != (pointer)0x0) {
            p_Var27 = (_Rb_tree_header *)
                      ((long)local_198.
                             super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)poVar18);
            operator_delete(poVar18,(ulong)p_Var27);
          }
          local_198.
          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = poVar17 + uVar25;
          local_198.
          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = poVar17;
          local_198.
          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = poVar6;
        }
        else {
          ((local_198.
            super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->
          super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
          ._M_engaged = false;
          if (local_80 == '\x01') {
            *(undefined8 *)
             &((local_198.
                super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
              super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
              ._M_payload._M_value._M_t = local_c8._24_8_;
            puVar3 = (undefined1 *)
                     ((long)&((local_198.
                               super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->
                             super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                             ._M_payload + 8);
            if (local_a0 == (_Base_ptr)0x0) {
              *(_Base_ptr *)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload._M_value._M_t + 0x10) = (_Base_ptr)0x0;
              *(undefined1 **)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload._M_value._M_t + 0x18) = puVar3;
              *(undefined1 **)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload + 0x20) = puVar3;
              puVar20 = (undefined8 *)
                        ((long)&((local_198.
                                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                ._M_payload + 0x28);
              auVar11[0] = '\0';
              auVar11[1] = '\0';
              auVar11[2] = '\0';
              auVar11[3] = '\0';
            }
            else {
              *(_Base_ptr *)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload + 0x10) = local_a0;
              *(_Rb_tree_header **)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload._M_value._M_t + 0x18) = local_98;
              *(_Rb_tree_header **)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload + 0x20) = p_Stack_90;
              *(undefined1 **)&((_Rb_tree_header *)&local_a0->_M_parent)->_M_header = puVar3;
              *(ulong *)((long)&((local_198.
                                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                ._M_payload + 0x28) = local_88;
              local_a0 = (_Base_ptr)0x0;
              local_98 = (_Rb_tree_header *)(local_c8 + 0x20);
              puVar20 = &local_88;
              auVar11 = (uchar  [4])local_c8._32_4_;
              p_Stack_90 = local_98;
            }
            *puVar20 = 0;
            *(uchar (*) [4])
             ((long)&((local_198.
                       super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->
                     super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                     ._M_payload + 8) = auVar11;
            ((local_198.
              super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
            ._M_engaged = true;
          }
        }
        p_Var21 = (_Rb_tree_header *)
                  (local_198.
                   super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1);
        pvVar26 = (void *)((long)pvStack_170 + -0x18);
        local_198.
        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var21;
        pvStack_170 = pvVar26;
        if (((local_78 & 1) != 0) && (local_78 = 0, local_80 == '\x01')) {
          local_80 = '\0';
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
          ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                      *)local_a0,(_Link_type)p_Var27);
        }
      }
      poVar18 = local_198.
                super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (pvVar26 != local_178);
  }
  pvVar26 = local_178;
  if ((long)p_Var21 - (long)poVar18 == 0x38) {
    local_c8[8] = '\0';
    if ((poVar18->
        super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
        .super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>.
        _M_engaged == true) {
      local_100._16_8_ =
           *(undefined8 *)
            &(poVar18->
             super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
             ._M_payload._M_value._M_t;
      local_d8 = (_Rb_tree_node_base *)(local_100 + 0x18);
      local_e0 = *(_Base_ptr *)
                  ((long)&(poVar18->
                          super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                          ._M_payload._M_value._M_t + 0x10);
      if (local_e0 == (_Base_ptr)0x0) {
        puVar20 = (undefined8 *)local_c8;
        local_e0 = (_Base_ptr)0x0;
        local_100._24_4_ = _S_red;
        p_Stack_d0 = local_d8;
      }
      else {
        puVar3 = (undefined1 *)
                 ((long)&(poVar18->
                         super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                         ._M_payload + 8);
        local_100._24_4_ =
             *(undefined4 *)
              ((long)&(poVar18->
                      super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                      ._M_payload + 8);
        p_Var24 = *(_Base_ptr *)
                   ((long)&(poVar18->
                           super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                           ._M_payload._M_value._M_t + 0x18);
        p_Stack_d0 = *(_Rb_tree_node_base **)
                      ((long)&(poVar18->
                              super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                              ._M_payload + 0x20);
        *(_Rb_tree_node_base **)&((_Rb_tree_header *)&local_e0->_M_parent)->_M_header = local_d8;
        puVar20 = (undefined8 *)
                  ((long)&(poVar18->
                          super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                          ._M_payload + 0x28);
        local_c8._0_8_ =
             *(undefined8 *)
              ((long)&(poVar18->
                      super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                      ._M_payload + 0x28);
        *(_Base_ptr *)
         ((long)&(poVar18->
                 super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                 ._M_payload._M_value._M_t + 0x10) = (_Base_ptr)0x0;
        *(undefined1 **)
         ((long)&(poVar18->
                 super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                 ._M_payload._M_value._M_t + 0x18) = puVar3;
        *(undefined1 **)
         ((long)&(poVar18->
                 super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                 ._M_payload + 0x20) = puVar3;
        local_d8 = p_Var24;
      }
      *puVar20 = 0;
      local_c8[8] = '\x01';
    }
    local_c8[0x10] = 1;
    std::
    vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
    ::~vector(&local_198);
    if (pvVar26 != (void *)0x0) {
      operator_delete(pvVar26,local_168 - (long)pvVar26);
    }
    p_Var4 = local_e0;
    if (local_c8[8] == '\x01') {
      local_120._M_left = &local_120;
      local_128 = (_Base_ptr)local_100._16_8_;
      if (local_e0 == (_Base_ptr)0x0) {
        local_120._M_color = _S_red;
        __x = (_Link_type)local_100;
        local_120._M_right = local_120._M_left;
      }
      else {
        __x = (_Link_type)local_c8;
        *(_Base_ptr *)&((_Rb_tree_header *)&local_e0->_M_parent)->_M_header = local_120._M_left;
        local_100._0_8_ = local_c8._0_8_;
        local_120._M_left = local_d8;
        local_120._M_right = p_Stack_d0;
        local_120._M_color = local_100._24_4_;
      }
      local_120._M_parent = local_e0;
      *(undefined8 *)&__x->super__Rb_tree_node_base = 0;
      local_100[8] = 0;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
      ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                  *)p_Var4,__x);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
LAB_00db9bc1:
    __stack_chk_fail();
  }
LAB_00db9b08:
  __assert_fail("results.size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                ,0x27e,
                "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = std::optional<std::set<unsigned int, Comp>>, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:679:13)]"
               );
}

Assistant:

void DuplicateKeyCheck(const Ctx& ctx) const
    {
        // We cannot use a lambda here, as lambdas are non assignable, and the set operations
        // below require moving the comparators around.
        struct Comp {
            const Ctx* ctx_ptr;
            Comp(const Ctx& ctx) : ctx_ptr(&ctx) {}
            bool operator()(const Key& a, const Key& b) const { return ctx_ptr->KeyCompare(a, b); }
        };

        // state in the recursive computation:
        // - std::nullopt means "this node has duplicates"
        // - an std::set means "this node has no duplicate keys, and they are: ...".
        using keyset = std::set<Key, Comp>;
        using state = std::optional<keyset>;

        auto upfn = [&ctx](const Node& node, Span<state> subs) -> state {
            // If this node is already known to have duplicates, nothing left to do.
            if (node.has_duplicate_keys.has_value() && *node.has_duplicate_keys) return {};

            // Check if one of the children is already known to have duplicates.
            for (auto& sub : subs) {
                if (!sub.has_value()) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            // Start building the set of keys involved in this node and children.
            // Start by keys in this node directly.
            size_t keys_count = node.keys.size();
            keyset key_set{node.keys.begin(), node.keys.end(), Comp(ctx)};
            if (key_set.size() != keys_count) {
                // It already has duplicates; bail out.
                node.has_duplicate_keys = true;
                return {};
            }

            // Merge the keys from the children into this set.
            for (auto& sub : subs) {
                keys_count += sub->size();
                // Small optimization: std::set::merge is linear in the size of the second arg but
                // logarithmic in the size of the first.
                if (key_set.size() < sub->size()) std::swap(key_set, *sub);
                key_set.merge(*sub);
                if (key_set.size() != keys_count) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            node.has_duplicate_keys = false;
            return key_set;
        };

        TreeEval<state>(upfn);
    }